

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64 max_value,uint64 *output)

{
  int iVar1;
  ulong *in_RDX;
  ulong in_RSI;
  int digit;
  uint64 result;
  int base;
  char *ptr;
  ulong local_38;
  int local_2c;
  char *local_28;
  
  local_28 = (char *)std::__cxx11::string::c_str();
  local_2c = 10;
  if (*local_28 == '0') {
    if ((local_28[1] == 'x') || (local_28[1] == 'X')) {
      local_2c = 0x10;
      local_28 = local_28 + 2;
    }
    else {
      local_2c = 8;
    }
  }
  local_38 = 0;
  while( true ) {
    if (*local_28 == '\0') {
      *in_RDX = local_38;
      return true;
    }
    iVar1 = anon_unknown_4::DigitValue(*local_28);
    if ((iVar1 < 0) || (local_2c <= iVar1)) break;
    if ((in_RSI < (ulong)(long)iVar1) || ((in_RSI - (long)iVar1) / (ulong)(long)local_2c < local_38)
       ) {
      return false;
    }
    local_38 = local_38 * (long)local_2c + (long)iVar1;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool Tokenizer::ParseInteger(const std::string& text, uint64 max_value,
                             uint64* output) {
  // Sadly, we can't just use strtoul() since it is only 32-bit and strtoull()
  // is non-standard.  I hate the C standard library.  :(

  //  return strtoull(text.c_str(), NULL, 0);

  const char* ptr = text.c_str();
  int base = 10;
  if (ptr[0] == '0') {
    if (ptr[1] == 'x' || ptr[1] == 'X') {
      // This is hex.
      base = 16;
      ptr += 2;
    } else {
      // This is octal.
      base = 8;
    }
  }

  uint64 result = 0;
  for (; *ptr != '\0'; ptr++) {
    int digit = DigitValue(*ptr);
    if (digit < 0 || digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (digit > max_value || result > (max_value - digit) / base) {
      // Overflow.
      return false;
    }
    result = result * base + digit;
  }

  *output = result;
  return true;
}